

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O3

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::isEquivalentTo(TimeArrayTimeZoneRule *this,TimeZoneRule *other)

{
  _func_int **pp_Var1;
  uint uVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  ulong uVar5;
  
  UVar3 = '\x01';
  if (this != (TimeArrayTimeZoneRule *)other) {
    __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
    __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
    if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)))) &&
        (UVar3 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar3 != '\0')) &&
       (this->fTimeRuleType == *(TimeRuleType *)&other[1].super_UObject._vptr_UObject)) {
      uVar2 = this->fNumStartTimes;
      if (uVar2 == *(uint *)((long)&other[1].super_UObject._vptr_UObject + 4)) {
        if ((int)uVar2 < 1) {
          return '\x01';
        }
        uVar5 = 0;
        while ((pp_Var1 = other[1].fName.super_Replaceable.super_UObject._vptr_UObject + uVar5,
               this->fStartTimes[uVar5] == (double)*pp_Var1 &&
               (!NAN(this->fStartTimes[uVar5]) && !NAN((double)*pp_Var1)))) {
          uVar5 = uVar5 + 1;
          if (uVar2 == uVar5) {
            return '\x01';
          }
        }
      }
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
TimeArrayTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    TimeArrayTimeZoneRule* that = (TimeArrayTimeZoneRule*)&other;
    if (fTimeRuleType != that->fTimeRuleType ||
        fNumStartTimes != that->fNumStartTimes) {
        return FALSE;
    }
    // Compare start times
    UBool res = TRUE;
    for (int32_t i = 0; i < fNumStartTimes; i++) {
        if (fStartTimes[i] != that->fStartTimes[i]) {
            res = FALSE;
            break;
        }
    }
    return res;
}